

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O3

reference __thiscall bitdeque<32768>::back(bitdeque<32768> *this)

{
  size_t extraout_RDX;
  bitdeque<32768> *in_RSI;
  long in_FS_OFFSET;
  reference rVar1;
  iterator local_78;
  Iterator<false> local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  end(&local_78,in_RSI);
  local_48.m_it._M_cur = local_78.m_it._M_cur;
  local_48.m_it._M_first = local_78.m_it._M_first;
  local_48.m_it._M_last = local_78.m_it._M_last;
  local_48.m_it._M_node = local_78.m_it._M_node;
  local_48.m_bitpos = local_78.m_bitpos;
  Iterator<false>::operator+=(&local_48,-1);
  (this->m_deque).super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
  _M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       ((long)((local_48.m_it._M_cur)->super__Base_bitset<512UL>)._M_w +
       ((ulong)(long)local_48.m_bitpos >> 3 & 0xfffffffffffffff8));
  (this->m_deque).super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = (ulong)(local_48.m_bitpos & 0x3f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    rVar1._M_bpos = extraout_RDX;
    rVar1._M_wp = (_WordT *)this;
    return rVar1;
  }
  __stack_chk_fail();
}

Assistant:

reference back() { return end()[-1]; }